

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_line.hpp
# Opt level: O0

ArgIface * __thiscall Args::CmdLine::findArgument(CmdLine *this,String *name)

{
  bool bVar1;
  int iVar2;
  pointer pAVar3;
  undefined4 extraout_var;
  undefined8 in_RSI;
  String *in_RDI;
  ArgIface *tmp;
  Command **c;
  const_iterator __end4;
  const_iterator __begin4;
  vector<Args::Command_*,_std::allocator<Args::Command_*>_> *__range4;
  __normal_iterator<const_std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_*,_std::vector<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>_>
  it;
  vector<Args::Command_*,_std::allocator<Args::Command_*>_> *in_stack_ffffffffffffff88;
  ArgIface *in_stack_ffffffffffffff98;
  vector<Args::Command_*,_std::allocator<Args::Command_*>_> *in_stack_ffffffffffffffa0;
  anon_class_8_1_898f2789_for__M_pred in_stack_ffffffffffffffa8;
  __normal_iterator<const_std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_*,_std::vector<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>_>
  in_stack_ffffffffffffffb0;
  __normal_iterator<const_std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_*,_std::vector<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>_>
  in_stack_ffffffffffffffb8;
  __normal_iterator<const_std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_*,_std::vector<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>_>
  local_20;
  undefined8 local_18;
  pointer local_8;
  
  local_18 = in_RSI;
  std::
  vector<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>
  ::cbegin((vector<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>
            *)in_stack_ffffffffffffff88);
  std::
  vector<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>
  ::cend((vector<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>
          *)in_stack_ffffffffffffff88);
  local_20 = std::
             find_if<__gnu_cxx::__normal_iterator<std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>const*,std::vector<std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>,std::allocator<std::unique_ptr<Args::ArgIface,Args::details::Deleter<Args::ArgIface>>>>>,Args::CmdLine::findArgument(std::__cxx11::string_const&)const::_lambda(auto:1_const&)_1_>
                       (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
                        in_stack_ffffffffffffffa8);
  std::
  vector<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>
  ::end((vector<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>
         *)in_stack_ffffffffffffff88);
  bVar1 = __gnu_cxx::operator!=
                    ((__normal_iterator<const_std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_*,_std::vector<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>_>
                      *)in_RDI,
                     (__normal_iterator<const_std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_*,_std::vector<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>_>
                      *)in_stack_ffffffffffffff88);
  if (bVar1) {
    __gnu_cxx::
    __normal_iterator<const_std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_*,_std::vector<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>_>
    ::operator*(&local_20);
    pAVar3 = std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>::operator->
                       ((unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_> *)
                        0x13f4c6);
    iVar2 = (*pAVar3->_vptr_ArgIface[2])();
    if (iVar2 == 0) {
      __gnu_cxx::
      __normal_iterator<const_std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_*,_std::vector<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>_>
      ::operator->(&local_20);
      local_8 = std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>::get
                          ((unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_> *)
                           in_RDI);
    }
    else {
      __gnu_cxx::
      __normal_iterator<const_std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_*,_std::vector<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>,_std::allocator<std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>_>_>_>
      ::operator*(&local_20);
      pAVar3 = std::unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_>::operator->
                         ((unique_ptr<Args::ArgIface,_Args::details::Deleter<Args::ArgIface>_> *)
                          0x13f502);
      iVar2 = (*pAVar3->_vptr_ArgIface[0xe])(pAVar3,local_18);
      local_8 = (pointer)CONCAT44(extraout_var,iVar2);
    }
  }
  else {
    bVar1 = std::vector<Args::Command_*,_std::allocator<Args::Command_*>_>::empty
                      (in_stack_ffffffffffffffa0);
    if (!bVar1) {
      std::vector<Args::Command_*,_std::allocator<Args::Command_*>_>::begin
                (in_stack_ffffffffffffff88);
      std::vector<Args::Command_*,_std::allocator<Args::Command_*>_>::end(in_stack_ffffffffffffff88)
      ;
      while (bVar1 = __gnu_cxx::operator!=
                               ((__normal_iterator<Args::Command_*const_*,_std::vector<Args::Command_*,_std::allocator<Args::Command_*>_>_>
                                 *)in_RDI,
                                (__normal_iterator<Args::Command_*const_*,_std::vector<Args::Command_*,_std::allocator<Args::Command_*>_>_>
                                 *)in_stack_ffffffffffffff88), bVar1) {
        __gnu_cxx::
        __normal_iterator<Args::Command_*const_*,_std::vector<Args::Command_*,_std::allocator<Args::Command_*>_>_>
        ::operator*((__normal_iterator<Args::Command_*const_*,_std::vector<Args::Command_*,_std::allocator<Args::Command_*>_>_>
                     *)&stack0xffffffffffffffb0);
        in_stack_ffffffffffffff98 = Command::findChild((Command *)in_stack_ffffffffffffff98,in_RDI);
        if (in_stack_ffffffffffffff98 != (ArgIface *)0x0) {
          return in_stack_ffffffffffffff98;
        }
        __gnu_cxx::
        __normal_iterator<Args::Command_*const_*,_std::vector<Args::Command_*,_std::allocator<Args::Command_*>_>_>
        ::operator++((__normal_iterator<Args::Command_*const_*,_std::vector<Args::Command_*,_std::allocator<Args::Command_*>_>_>
                      *)&stack0xffffffffffffffb0);
      }
    }
    local_8 = (pointer)0x0;
  }
  return local_8;
}

Assistant:

const ArgIface * findArgument( const String & name ) const
	{
		auto it = std::find_if( m_args.cbegin(),
			m_args.cend(), [ &name ] ( const auto & arg ) -> bool
				{ return ( arg->findArgument( name ) != nullptr ); } );

		if( it != m_args.end() )
		{
			if( (*it)->type() == ArgType::Command )
				return it->get();
			else
				return (*it)->findArgument( name );
		}
		else if( !m_prevCommand.empty() )
		{
			for( const auto & c : m_prevCommand )
			{
				ArgIface * tmp = c->findChild( name );

				if( tmp )
					return tmp;
			}
		}

		return nullptr;
	}